

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O3

void __thiscall FIWadManager::ParseIWadInfo(FIWadManager *this,char *fn,char *data,int datasize)

{
  TArray<FString,_FString> *this_00;
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  DWORD DVar4;
  int iVar5;
  char *pcVar6;
  FIWADInfo *this_01;
  FIWADInfo *pFVar7;
  FString wadname;
  FScanner sc;
  FString local_168;
  FIWADInfo *local_160;
  FIWADInfo *local_158;
  TArray<FString,_FString> *local_150;
  FIWADInfo *local_148;
  TArray<FString,_FString> *local_140;
  FIWADInfo *local_138;
  FScanner local_130;
  
  FScanner::FScanner(&local_130);
  FScanner::OpenMem(&local_130,"IWADINFO",data,datasize);
  this_00 = &this->mIWadNames;
  do {
    while( true ) {
      bVar2 = FScanner::GetString(&local_130);
      if (!bVar2) {
        FScanner::~FScanner(&local_130);
        return;
      }
      bVar2 = FScanner::Compare(&local_130,"IWAD");
      if (bVar2) break;
      bVar2 = FScanner::Compare(&local_130,"NAMES");
      if (bVar2) {
        FScanner::MustGetStringName(&local_130,"{");
        local_168.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        TArray<FString,_FString>::Grow(this_00,1);
        FString::AttachToOther((this->mIWadNames).Array + (this->mIWadNames).Count,&local_168);
        while( true ) {
          puVar1 = &(this->mIWadNames).Count;
          *puVar1 = *puVar1 + 1;
          FString::~FString(&local_168);
          bVar2 = FScanner::CheckString(&local_130,"}");
          if (bVar2) break;
          FScanner::MustGetString(&local_130);
          FString::FString(&local_168,local_130.String);
          FString::ToLower(&local_168);
          TArray<FString,_FString>::Grow(this_00,1);
          FString::AttachToOther((this->mIWadNames).Array + (this->mIWadNames).Count,&local_168);
          puVar1 = &(this->mIWadNames).Count;
          *puVar1 = *puVar1 + 1;
          iVar5 = toupper((int)*local_168.Chars);
          pcVar6 = FString::LockBuffer(&local_168);
          *pcVar6 = (char)iVar5;
          FString::UnlockBuffer(&local_168);
          TArray<FString,_FString>::Grow(this_00,1);
          FString::AttachToOther((this->mIWadNames).Array + (this->mIWadNames).Count,&local_168);
          puVar1 = &(this->mIWadNames).Count;
          *puVar1 = *puVar1 + 1;
          FString::ToUpper(&local_168);
          TArray<FString,_FString>::Grow(this_00,1);
          FString::AttachToOther((this->mIWadNames).Array + (this->mIWadNames).Count,&local_168);
        }
      }
    }
    uVar3 = TArray<FIWADInfo,_FIWADInfo>::Reserve(&this->mIWads,1);
    pFVar7 = (this->mIWads).Array + uVar3;
    FScanner::MustGetStringName(&local_130,"{");
    local_158 = (FIWADInfo *)&pFVar7->Required;
    local_150 = &pFVar7->Load;
    local_140 = &pFVar7->Lumps;
    local_160 = (FIWADInfo *)&pFVar7->MapInfo;
    local_148 = (FIWADInfo *)&pFVar7->Configname;
    local_138 = (FIWADInfo *)&pFVar7->Autoname;
    while (bVar2 = FScanner::CheckString(&local_130,"}"), !bVar2) {
      FScanner::MustGetString(&local_130);
      bVar2 = FScanner::Compare(&local_130,"Name");
      if (bVar2) {
        FScanner::MustGetStringName(&local_130,"=");
        FScanner::MustGetString(&local_130);
        this_01 = pFVar7;
LAB_004b6dcf:
        FString::operator=(&this_01->Name,local_130.String);
      }
      else {
        bVar2 = FScanner::Compare(&local_130,"Autoname");
        if (bVar2) {
          FScanner::MustGetStringName(&local_130,"=");
          FScanner::MustGetString(&local_130);
          this_01 = local_138;
          goto LAB_004b6dcf;
        }
        bVar2 = FScanner::Compare(&local_130,"Config");
        if (bVar2) {
          FScanner::MustGetStringName(&local_130,"=");
          FScanner::MustGetString(&local_130);
          this_01 = local_148;
          goto LAB_004b6dcf;
        }
        bVar2 = FScanner::Compare(&local_130,"Game");
        if (bVar2) {
          FScanner::MustGetStringName(&local_130,"=");
          FScanner::MustGetString(&local_130);
          bVar2 = FScanner::Compare(&local_130,"Doom");
          if (bVar2) {
            pFVar7->gametype = GAME_Doom;
          }
          else {
            bVar2 = FScanner::Compare(&local_130,"Heretic");
            if (bVar2) {
              pFVar7->gametype = GAME_Heretic;
            }
            else {
              bVar2 = FScanner::Compare(&local_130,"Hexen");
              if (bVar2) {
                pFVar7->gametype = GAME_Hexen;
              }
              else {
                bVar2 = FScanner::Compare(&local_130,"Strife");
                if (bVar2) {
                  pFVar7->gametype = GAME_Strife;
                }
                else {
                  bVar2 = FScanner::Compare(&local_130,"Chex");
                  if (bVar2) {
                    pFVar7->gametype = GAME_Chex;
                  }
                  else {
                    FScanner::ScriptError(&local_130,(char *)0x0);
                  }
                }
              }
            }
          }
        }
        else {
          bVar2 = FScanner::Compare(&local_130,"Mapinfo");
          if (bVar2) {
            FScanner::MustGetStringName(&local_130,"=");
            FScanner::MustGetString(&local_130);
            this_01 = local_160;
            goto LAB_004b6dcf;
          }
          bVar2 = FScanner::Compare(&local_130,"Compatibility");
          if (bVar2) {
            FScanner::MustGetStringName(&local_130,"=");
            do {
              FScanner::MustGetString(&local_130);
              bVar2 = FScanner::Compare(&local_130,"NoTextcolor");
              uVar3 = 0x100;
              if (bVar2) {
LAB_004b6f56:
                pFVar7->flags = pFVar7->flags | uVar3;
              }
              else {
                bVar2 = FScanner::Compare(&local_130,"Poly1");
                uVar3 = 0x40;
                if (bVar2) goto LAB_004b6f56;
                bVar2 = FScanner::Compare(&local_130,"Poly2");
                uVar3 = 0x80;
                if (bVar2) goto LAB_004b6f56;
                bVar2 = FScanner::Compare(&local_130,"Shareware");
                uVar3 = 2;
                if (bVar2) goto LAB_004b6f56;
                bVar2 = FScanner::Compare(&local_130,"Teaser2");
                uVar3 = 8;
                if (bVar2) goto LAB_004b6f56;
                bVar2 = FScanner::Compare(&local_130,"Extended");
                uVar3 = 4;
                if (bVar2) goto LAB_004b6f56;
                bVar2 = FScanner::Compare(&local_130,"Shorttex");
                uVar3 = 0x10;
                if (bVar2) goto LAB_004b6f56;
                bVar2 = FScanner::Compare(&local_130,"Stairs");
                uVar3 = 0x20;
                if (bVar2) goto LAB_004b6f56;
                FScanner::ScriptError(&local_130,(char *)0x0);
              }
              bVar2 = FScanner::CheckString(&local_130,",");
            } while (bVar2);
          }
          else {
            bVar2 = FScanner::Compare(&local_130,"MustContain");
            if (bVar2) {
              FScanner::MustGetStringName(&local_130,"=");
              do {
                FScanner::MustGetString(&local_130);
                FString::FString(&local_168,local_130.String);
                TArray<FString,_FString>::Grow(local_140,1);
                FString::AttachToOther((pFVar7->Lumps).Array + (pFVar7->Lumps).Count,&local_168);
                puVar1 = &(pFVar7->Lumps).Count;
                *puVar1 = *puVar1 + 1;
                FString::~FString(&local_168);
                bVar2 = FScanner::CheckString(&local_130,",");
              } while (bVar2);
            }
            else {
              bVar2 = FScanner::Compare(&local_130,"BannerColors");
              if (bVar2) {
                FScanner::MustGetStringName(&local_130,"=");
                FScanner::MustGetString(&local_130);
                DVar4 = V_GetColor((DWORD *)0x0,local_130.String);
                pFVar7->FgColor = DVar4;
                FScanner::MustGetStringName(&local_130,",");
                FScanner::MustGetString(&local_130);
                DVar4 = V_GetColor((DWORD *)0x0,local_130.String);
                pFVar7->BkColor = DVar4;
              }
              else {
                bVar2 = FScanner::Compare(&local_130,"Load");
                if (bVar2) {
                  FScanner::MustGetStringName(&local_130,"=");
                  do {
                    FScanner::MustGetString(&local_130);
                    FString::FString(&local_168,local_130.String);
                    TArray<FString,_FString>::Grow(local_150,1);
                    FString::AttachToOther((pFVar7->Load).Array + (pFVar7->Load).Count,&local_168);
                    puVar1 = &(pFVar7->Load).Count;
                    *puVar1 = *puVar1 + 1;
                    FString::~FString(&local_168);
                    bVar2 = FScanner::CheckString(&local_130,",");
                  } while (bVar2);
                }
                else {
                  bVar2 = FScanner::Compare(&local_130,"Required");
                  if (bVar2) {
                    FScanner::MustGetStringName(&local_130,"=");
                    FScanner::MustGetString(&local_130);
                    this_01 = local_158;
                    goto LAB_004b6dcf;
                  }
                  FScanner::ScriptError(&local_130,"Unknown keyword \'%s\'",local_130.String);
                }
              }
            }
          }
        }
      }
    }
    if (*(int *)((local_160->Name).Chars + -0xc) == 0) {
      FString::operator=(&local_160->Name,"mapinfo/mindefaults.txt");
    }
  } while( true );
}

Assistant:

void FIWadManager::ParseIWadInfo(const char *fn, const char *data, int datasize)
{
	FScanner sc;

	sc.OpenMem("IWADINFO", data, datasize);
	while (sc.GetString())
	{
		if (sc.Compare("IWAD"))
		{
			FIWADInfo *iwad = &mIWads[mIWads.Reserve(1)];
			sc.MustGetStringName("{");
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				if (sc.Compare("Name"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Name = sc.String;
				}
				else if (sc.Compare("Autoname"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Autoname = sc.String;
				}
				else if (sc.Compare("Config"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Configname = sc.String;
				}
				else if (sc.Compare("Game"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					if (sc.Compare("Doom")) iwad->gametype = GAME_Doom;
					else if (sc.Compare("Heretic")) iwad->gametype = GAME_Heretic;
					else if (sc.Compare("Hexen")) iwad->gametype = GAME_Hexen;
					else if (sc.Compare("Strife")) iwad->gametype = GAME_Strife;
					else if (sc.Compare("Chex")) iwad->gametype = GAME_Chex;
					else sc.ScriptError(NULL);
				}
				else if (sc.Compare("Mapinfo"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->MapInfo = sc.String;
				}
				else if (sc.Compare("Compatibility"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						if(sc.Compare("NoTextcolor")) iwad->flags |= GI_NOTEXTCOLOR;
						else if(sc.Compare("Poly1")) iwad->flags |= GI_COMPATPOLY1;
						else if(sc.Compare("Poly2")) iwad->flags |= GI_COMPATPOLY2;
						else if(sc.Compare("Shareware")) iwad->flags |= GI_SHAREWARE;
						else if(sc.Compare("Teaser2")) iwad->flags |= GI_TEASER2;
						else if(sc.Compare("Extended")) iwad->flags |= GI_MENUHACK_EXTENDED;
						else if(sc.Compare("Shorttex")) iwad->flags |= GI_COMPATSHORTTEX;
						else if(sc.Compare("Stairs")) iwad->flags |= GI_COMPATSTAIRS;
						else sc.ScriptError(NULL);
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("MustContain"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						iwad->Lumps.Push(FString(sc.String));
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("BannerColors"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->FgColor = V_GetColor(NULL, sc.String);
					sc.MustGetStringName(",");
					sc.MustGetString();
					iwad->BkColor = V_GetColor(NULL, sc.String);
				}
				else if (sc.Compare("Load"))
				{
					sc.MustGetStringName("=");
					do
					{
						sc.MustGetString();
						iwad->Load.Push(FString(sc.String));
					}
					while (sc.CheckString(","));
				}
				else if (sc.Compare("Required"))
				{
					sc.MustGetStringName("=");
					sc.MustGetString();
					iwad->Required = sc.String;
				}
				else
				{
					sc.ScriptError("Unknown keyword '%s'", sc.String);
				}
			}
			if (iwad->MapInfo.IsEmpty())
			{
				// We must at least load the minimum defaults to allow the engine to run.
				iwad->MapInfo = "mapinfo/mindefaults.txt";
			}
		}
		else if (sc.Compare("NAMES"))
		{
			sc.MustGetStringName("{");
			mIWadNames.Push(FString());
			while (!sc.CheckString("}"))
			{
				sc.MustGetString();
				FString wadname = sc.String;
#if defined(_WIN32) || defined(__APPLE__) // Turns out Mac OS X is case insensitive.
				mIWadNames.Push(wadname);
#else
				// check for lowercase, uppercased first letter and full uppercase on Linux etc.
				wadname.ToLower();
				mIWadNames.Push(wadname);
				wadname.LockBuffer()[0] = toupper(wadname[0]);
				wadname.UnlockBuffer();
				mIWadNames.Push(wadname);
				wadname.ToUpper();
				mIWadNames.Push(wadname);
#endif
			}
		}
	}
}